

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::egl::anon_unknown_1::LoseContextOnResetCase::iterate(LoseContextOnResetCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  GLenum err;
  deUint32 err_00;
  char *description;
  bool bVar3;
  GLint reset;
  RenderingContext context;
  EGLint attribList [9];
  Functions gl;
  GLint local_1c3c;
  RenderingContext local_1c38;
  Enum<int,_2UL> local_1c08;
  EGLint local_1bf8 [12];
  undefined1 local_1bc8 [120];
  ios_base local_1b50 [264];
  undefined1 local_1a48 [120];
  ios_base local_19d0 [1928];
  glGetErrorFunc local_1248;
  glGetGraphicsResetStatusFunc local_1208;
  glGetIntegervFunc local_11e0;
  
  pTVar2 = ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  poVar1 = (ostringstream *)(local_1a48 + 8);
  local_1a48._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Check the reset notification strategy returned by glGetIntegerv() equals GL_LOSE_CONTEXT_ON_RESET\n\n"
             ,99);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a48,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_19d0);
  local_1bf8[4] = 0x30bf;
  local_1bf8[5] = 1;
  local_1bf8[6] = 0x3138;
  local_1bf8[7] = 0x31bf;
  local_1bf8[0] = 0x3098;
  local_1bf8[1] = 3;
  local_1bf8[2] = 0x30fb;
  local_1bf8[3] = 1;
  local_1bf8[8] = 0x3038;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,local_1bf8);
  local_1a48._0_8_ = (TestLog *)0x0;
  RenderingContext::RenderingContext
            (&local_1c38,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,local_1bf8,
             &(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,(EGLContext *)local_1a48);
  RenderingContext::makeCurrent(&local_1c38,&(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions((Functions *)local_1a48);
  RenderingContext::initGLFunctions(&local_1c38,(Functions *)local_1a48);
  checkRequiredGLRobustnessExtension(local_1bf8,(Functions *)local_1a48);
  local_1c3c = 0;
  (*local_11e0)(0x8256,&local_1c3c);
  err = (*local_1248)();
  glu::checkError(err,"glGetIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x5f6);
  bVar3 = local_1c3c != 0x8252;
  local_1bc8._0_8_ = pTVar2;
  if (bVar3) {
    poVar1 = (ostringstream *)(local_1bc8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Test failed! glGetIntegerv() returned wrong value. [",0x34);
    std::ostream::operator<<(poVar1,local_1c3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected ",0xb);
    local_1c08.m_getName = glu::getErrorName;
    local_1c08.m_value = 0x8252;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c08,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bc8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_1b50);
    description = "Fail";
  }
  else {
    poVar1 = (ostringstream *)(local_1bc8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Check the graphics reset status returned by glGetGraphicsResetStatus() ",0x47);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"equals GL_NO_ERROR\n",0x13);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bc8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_1b50);
    (*local_1208)();
    err_00 = (*local_1248)();
    glu::checkError(err_00,"getGraphicsResetStatus()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x607);
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             ,(uint)bVar3,description);
  RenderingContext::~RenderingContext(&local_1c38);
  return STOP;
}

Assistant:

TestCase::IterateResult	iterate		(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "Check the reset notification strategy returned by glGetIntegerv() equals GL_LOSE_CONTEXT_ON_RESET\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribList[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribList);

		RenderingContext context(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		context.makeCurrent(m_eglSurface);

		glw::Functions gl;
		context.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribList, gl);

		glw::GLint reset = 0;
		gl.getIntegerv(GL_RESET_NOTIFICATION_STRATEGY, &reset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

		if (reset != GL_LOSE_CONTEXT_ON_RESET)
		{
			log	<< tcu::TestLog::Message
				<< "Test failed! glGetIntegerv() returned wrong value. [" << reset << ", expected " << glu::getErrorStr(GL_LOSE_CONTEXT_ON_RESET) << "]"
				<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		log << tcu::TestLog::Message
			<< "Check the graphics reset status returned by glGetGraphicsResetStatus() "
			<< "equals GL_NO_ERROR\n"
			<< tcu::TestLog::EndMessage;

		GLU_CHECK_GLW_CALL(gl, getGraphicsResetStatus());

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}